

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFCodewordDecoder.cpp
# Opt level: O2

int ZXing::Pdf417::CodewordDecoder::GetDecodedValue(array<int,_8UL> *moduleBitCount)

{
  int i;
  int iVar1;
  int iVar2;
  int iVar3;
  size_t i_1;
  int iVar4;
  size_t j;
  long lVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  int j_1;
  int8_t size;
  char cVar10;
  uint uVar11;
  bool bVar12;
  float fVar13;
  float error;
  float fVar14;
  float fVar15;
  ModuleBitCountType result;
  value_type_conflict3 local_1c;
  
  iVar4 = 0;
  iVar1 = Reduce<std::array<int,8ul>,int,std::plus<int>>(moduleBitCount,0);
  local_1c = 0;
  std::array<int,_8UL>::fill(&result,&local_1c);
  iVar3 = 0;
  for (iVar2 = 0; iVar2 != 0x11; iVar2 = iVar2 + 1) {
    lVar5 = (long)iVar3;
    iVar7 = moduleBitCount->_M_elems[lVar5] + iVar4;
    if ((float)iVar7 <= ((float)iVar2 * (float)iVar1) / 17.0 + (float)iVar1 / 34.0) {
      iVar3 = iVar3 + 1;
      if (iVar3 == 8) break;
      lVar5 = (long)iVar3;
      iVar4 = iVar7;
    }
    result._M_elems[lVar5] = result._M_elems[lVar5] + 1;
  }
  uVar11 = 0;
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
    iVar4 = result._M_elems[lVar5];
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    while (bVar12 = iVar4 != 0, iVar4 = iVar4 + -1, bVar12) {
      uVar11 = ((uint)lVar5 & 1) + uVar11 * 2 ^ 1;
    }
  }
  iVar4 = GetCodeword(uVar11);
  if (uVar11 == 0xffffffff || iVar4 == -1) {
    if (GetClosestDecodedValue(std::array<int,8ul>const&)::ratioTable == '\0') {
      iVar4 = __cxa_guard_acquire(&GetClosestDecodedValue(std::array<int,8ul>const&)::ratioTable);
      if (iVar4 != 0) {
        std::vector<std::array<float,_8UL>,_std::allocator<std::array<float,_8UL>_>_>::vector
                  ((vector<std::array<float,_8UL>,_std::allocator<std::array<float,_8UL>_>_> *)
                   &GetClosestDecodedValue(std::array<int,8ul>const&)::ratioTable,0xae3,
                   (allocator_type *)&result);
        lVar5 = GetClosestDecodedValue(std::array<int,8ul>const&)::ratioTable;
        for (lVar6 = 0; lVar6 != 0xae3; lVar6 = lVar6 + 1) {
          uVar8 = (ushort)(&SYMBOL_TABLE)[lVar6] + 0x10000;
          uVar11 = (ushort)(&SYMBOL_TABLE)[lVar6] & 1;
          for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
            cVar10 = '\0';
            while( true ) {
              if ((uVar8 & 1) != uVar11) break;
              cVar10 = cVar10 + '\x01';
              uVar8 = (int)uVar8 >> 1;
            }
            *(float *)(lVar6 * 0x20 + lVar5 + (ulong)(uint)((7 - (int)lVar9) * 4)) =
                 (float)(int)cVar10 / 17.0;
            uVar11 = uVar8 & 1;
          }
        }
        __cxa_atexit(std::vector<std::array<float,_8UL>,_std::allocator<std::array<float,_8UL>_>_>::
                     ~vector,&GetClosestDecodedValue(std::array<int,8ul>const&)::ratioTable,
                     &__dso_handle);
        __cxa_guard_release(&GetClosestDecodedValue(std::array<int,8ul>const&)::ratioTable);
      }
    }
    iVar4 = Reduce<std::array<int,8ul>,int,std::plus<int>>(moduleBitCount,0);
    result._M_elems[4] = 0;
    result._M_elems[5] = 0;
    result._M_elems[6] = 0;
    result._M_elems[7] = 0;
    result._M_elems[0] = 0;
    result._M_elems[1] = 0;
    result._M_elems[2] = 0;
    result._M_elems[3] = 0;
    if (1 < iVar4) {
      for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
        result._M_elems[lVar5] = (int)((float)moduleBitCount->_M_elems[lVar5] / (float)iVar4);
      }
    }
    fVar13 = 3.4028235e+38;
    uVar11 = 0xffffffff;
    lVar5 = GetClosestDecodedValue(std::array<int,8ul>const&)::ratioTable;
    for (lVar6 = 0;
        lVar6 != DAT_0020f8d8 - GetClosestDecodedValue(std::array<int,8ul>const&)::ratioTable >> 5;
        lVar6 = lVar6 + 1) {
      fVar14 = 0.0;
      lVar9 = 0;
      do {
        if (lVar9 == 8) break;
        fVar15 = *(float *)(lVar5 + lVar9 * 4) - (float)result._M_elems[lVar9];
        fVar14 = fVar14 + fVar15 * fVar15;
        lVar9 = lVar9 + 1;
      } while (fVar14 < fVar13);
      if (fVar14 < fVar13) {
        uVar11 = (ushort)(&SYMBOL_TABLE)[(int)lVar6] | 0x10000;
        fVar13 = fVar14;
      }
      lVar5 = lVar5 + 0x20;
    }
  }
  return uVar11;
}

Assistant:

int
CodewordDecoder::GetDecodedValue(const std::array<int, BARS_IN_MODULE>& moduleBitCount)
{
	int decodedValue = GetDecodedCodewordValue(SampleBitCounts(moduleBitCount));
	if (decodedValue != -1) {
		return decodedValue;
	}
	return GetClosestDecodedValue(moduleBitCount);
}